

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  float value;
  double value_00;
  cpp cVar1;
  Type TVar2;
  Descriptor *this_00;
  long *plVar3;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar4;
  LogMessage *other;
  long lVar5;
  undefined1 qualified;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  int number;
  unsigned_long i;
  char *pcVar8;
  cpp *this_02;
  char *pcVar9;
  _Alloc_hider in_stack_fffffffffffffdb8;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [2];
  undefined1 local_210 [48];
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [48];
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  this_02 = this;
  TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
  qualified = 0x40;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4)) {
  case 1:
    Int32ToString_abi_cxx11_(__return_storage_ptr__,(cpp *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    return __return_storage_ptr__;
  case 2:
    Int64ToString_abi_cxx11_(__return_storage_ptr__,*(cpp **)(this + 0xa0),i);
    return __return_storage_ptr__;
  case 3:
    SimpleItoa_abi_cxx11_
              ((string *)&stack0xfffffffffffffdb8,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i)
    ;
    plVar3 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdb8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar7) {
      lVar5 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_1a0._16_8_ = local_238[0]._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffdb8._M_p == local_238) {
      return __return_storage_ptr__;
    }
    break;
  case 4:
    SimpleItoa_abi_cxx11_((string *)local_210,*(protobuf **)(this + 0xa0),i);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,0x34fb17);
    _Var10._M_p = (pointer)local_238;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar6) {
      local_238[0]._0_8_ = paVar6->_M_allocated_capacity;
      local_238[0]._8_8_ = plVar3[3];
    }
    else {
      local_238[0]._0_8_ = paVar6->_M_allocated_capacity;
      _Var10._M_p = (pointer)*plVar3;
    }
    *plVar3 = (long)paVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdb8);
    goto LAB_0020e88c;
  case 5:
    value_00 = *(double *)(this + 0xa0);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this_02,value_00);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "::google::protobuf::internal::NaN()";
        pcVar8 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "-::google::protobuf::internal::Infinity()";
        pcVar8 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "::google::protobuf::internal::Infinity()";
      pcVar8 = "";
    }
    goto LAB_0020e72a;
  case 6:
    value = *(float *)(this + 0xa0);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this_02,value);
          lVar5 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x34fc2a,0);
          if (lVar5 == -1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "static_cast<float>(::google::protobuf::internal::NaN())";
        pcVar8 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "static_cast<float>(-::google::protobuf::internal::Infinity())";
        pcVar8 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "static_cast<float>(::google::protobuf::internal::Infinity())";
      pcVar8 = "";
    }
    goto LAB_0020e72a;
  case 7:
    cVar1 = this[0xa0];
    pcVar9 = "false";
    if ((ulong)(byte)cVar1 != 0) {
      pcVar9 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = pcVar9 + ((ulong)(byte)cVar1 ^ 5);
    goto LAB_0020e72a;
  case 8:
    this_01 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    ClassName_abi_cxx11_(&local_1c0,(cpp *)this_01,(EnumDescriptor *)0x1,(bool)qualified);
    _Var10._M_p = local_1c0._M_dataplus._M_p;
    pEVar4 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    Int32ToString_abi_cxx11_(&local_1e0,(cpp *)(ulong)*(uint *)(pEVar4 + 0x10),number);
    local_210._0_8_ = local_1e0._M_dataplus._M_p;
    local_210._8_4_ = (int)local_1e0._M_string_length;
    local_1a0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1a0._8_4_ = -1;
    local_50.text_ = (char *)0x0;
    local_50.size_ = -1;
    local_80.text_ = (char *)0x0;
    local_80.size_ = -1;
    local_b0.text_ = (char *)0x0;
    local_b0.size_ = -1;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    local_110.text_ = (char *)0x0;
    local_110.size_ = -1;
    local_140.text_ = (char *)0x0;
    local_140.size_ = -1;
    local_170.text_ = (char *)0x0;
    local_170.size_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",&stack0xfffffffffffffdb8,
               (SubstituteArg *)local_210,(SubstituteArg *)local_1a0,&local_50,&local_80,&local_b0,
               &local_e0,&local_110,&local_140,&local_170,(SubstituteArg *)_Var10._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    local_1a0._16_8_ = local_1c0.field_2._M_allocated_capacity;
    in_stack_fffffffffffffdb8._M_p = local_1c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 9:
    CEscape((string *)local_1a0,*(string **)(this + 0xa0));
    EscapeTrigraphs((string *)local_210,(string *)local_1a0);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,0x351813);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar6) {
      local_238[0]._0_8_ = paVar6->_M_allocated_capacity;
      local_238[0]._8_8_ = plVar3[3];
      _Var10._M_p = (pointer)local_238;
    }
    else {
      local_238[0]._0_8_ = paVar6->_M_allocated_capacity;
      _Var10._M_p = (pointer)*plVar3;
    }
    *plVar3 = (long)paVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdb8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar7) {
      lVar5 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != local_238) {
      operator_delete(_Var10._M_p,local_238[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_210 + 0x10)) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    in_stack_fffffffffffffdb8._M_p = (pointer)local_1a0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1a0 + 0x10)) {
      return __return_storage_ptr__;
    }
    break;
  case 10:
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassName_abi_cxx11_((string *)local_210,(cpp *)this_00,(Descriptor *)0x1,(bool)qualified);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,0x378668);
    _Var10._M_p = (pointer)local_238;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar6) {
      local_238[0]._0_8_ = paVar6->_M_allocated_capacity;
      local_238[0]._8_8_ = plVar3[3];
    }
    else {
      local_238[0]._0_8_ = paVar6->_M_allocated_capacity;
      _Var10._M_p = (pointer)*plVar3;
    }
    *plVar3 = (long)paVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdb8);
LAB_0020e88c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar7) {
      lVar5 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != local_238) {
      operator_delete(_Var10._M_p,local_238[0]._M_allocated_capacity + 1);
    }
    local_1a0._16_8_ = local_210._16_8_;
    in_stack_fffffffffffffdb8._M_p = (pointer)local_210._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_210 + 0x10)) {
      return __return_storage_ptr__;
    }
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xfffffffffffffdb8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1a8);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&stack0xfffffffffffffdb8,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_210,other);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xfffffffffffffdb8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "";
    pcVar9 = "";
LAB_0020e72a:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
    return __return_storage_ptr__;
  }
  operator_delete(in_stack_fffffffffffffdb8._M_p,local_1a0._16_8_ + 1);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return Int32ToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString(field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return "GOOGLE_ULONGLONG(" + SimpleItoa(field->default_value_uint64())+ ")";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "::google::protobuf::internal::Infinity()";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "-::google::protobuf::internal::Infinity()";
      } else if (value != value) {
        return "::google::protobuf::internal::NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT:
      {
        float value = field->default_value_float();
        if (value == std::numeric_limits<float>::infinity()) {
          return "static_cast<float>(::google::protobuf::internal::Infinity())";
        } else if (value == -std::numeric_limits<float>::infinity()) {
          return "static_cast<float>(-::google::protobuf::internal::Infinity())";
        } else if (value != value) {
          return "static_cast<float>(::google::protobuf::internal::NaN())";
        } else {
          string float_value = SimpleFtoa(value);
          // If floating point value contains a period (.) or an exponent
          // (either E or e), then append suffix 'f' to make it a float
          // literal.
          if (float_value.find_first_of(".eE") != string::npos) {
            float_value.push_back('f');
          }
          return float_value;
        }
      }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)",
          ClassName(field->enum_type(), true),
          Int32ToString(field->default_value_enum()->number()));
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" + EscapeTrigraphs(
        CEscape(field->default_value_string())) +
        "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "*" + FieldMessageTypeName(field) +
             "::internal_default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}